

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atari2600.cpp
# Opt level: O3

void __thiscall
Atari2600::Joystick::Joystick(Joystick *this,Bus *bus,size_t shift,size_t fire_tia_input)

{
  initializer_list<Inputs::Joystick::Input> __l;
  allocator_type local_91;
  vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_> local_90;
  Input local_78;
  undefined4 local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined4 local_38;
  undefined8 local_30;
  
  local_78.type = Up;
  local_78.info = (Info)0x0;
  local_68 = 1;
  local_60 = 0;
  local_58 = 2;
  local_50 = 0;
  local_48 = 3;
  local_40 = 0;
  local_38 = 6;
  local_30 = 0;
  __l._M_len = 5;
  __l._M_array = &local_78;
  std::vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>::vector
            (&local_90,__l,&local_91);
  Inputs::ConcreteJoystick::ConcreteJoystick(&this->super_ConcreteJoystick,&local_90);
  if (local_90.super__Vector_base<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_ConcreteJoystick).super_Joystick._vptr_Joystick =
       (_func_int **)&PTR__ConcreteJoystick_00596200;
  this->bus_ = bus;
  this->shift_ = shift;
  this->fire_tia_input_ = fire_tia_input;
  return;
}

Assistant:

Joystick(Bus *bus, std::size_t shift, std::size_t fire_tia_input) :
			ConcreteJoystick({
				Input(Input::Up),
				Input(Input::Down),
				Input(Input::Left),
				Input(Input::Right),
				Input(Input::Fire)
			}),
			bus_(bus), shift_(shift), fire_tia_input_(fire_tia_input) {}